

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O0

void __thiscall SpecificStrategy::matchBlocks(SpecificStrategy *this,Block *aBlocks,Block *bBlocks)

{
  bool bVar1;
  bool bVar2;
  reference this_00;
  reference n;
  Node *bNode;
  Node *aNode;
  iterator aED;
  iterator aIT;
  iterator iStack_30;
  bool next;
  iterator bED;
  iterator bIT;
  Block *bBlocks_local;
  Block *aBlocks_local;
  SpecificStrategy *this_local;
  
  bED = std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::begin
                  (&bBlocks->perfect);
  iStack_30 = std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::end
                        (&bBlocks->perfect);
  do {
    bVar1 = std::operator!=(&bED,&stack0xffffffffffffffd0);
    if (!bVar1) {
      return;
    }
    bVar1 = true;
    aED = std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::begin
                    (&aBlocks->perfect);
    aNode = (Node *)std::
                    set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::
                    end(&aBlocks->perfect);
    while (bVar2 = std::operator!=(&aED,(_Self *)&aNode), bVar2) {
      this_00 = std::_Rb_tree_const_iterator<CfgData::Node>::operator*(&aED);
      n = std::_Rb_tree_const_iterator<CfgData::Node>::operator*(&bED);
      bVar2 = CfgData::Node::operator==(this_00,n);
      if (bVar2) {
        bED = std::set<CfgData::Node,std::less<CfgData::Node>,std::allocator<CfgData::Node>>::
              erase_abi_cxx11_((set<CfgData::Node,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
                                *)bBlocks,bED._M_node);
        bVar1 = false;
        break;
      }
      if ((this_00->start < n->start + (long)n->size) &&
         (n->start < this_00->start + (long)this_00->size)) {
        std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::insert
                  (&aBlocks->conflict,this_00);
        std::set<CfgData::Node,std::less<CfgData::Node>,std::allocator<CfgData::Node>>::
        erase_abi_cxx11_((set<CfgData::Node,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
                          *)aBlocks,(const_iterator)aED._M_node);
        std::set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>::insert
                  (&bBlocks->conflict,n);
        bED = std::set<CfgData::Node,std::less<CfgData::Node>,std::allocator<CfgData::Node>>::
              erase_abi_cxx11_((set<CfgData::Node,std::less<CfgData::Node>,std::allocator<CfgData::Node>>
                                *)bBlocks,bED._M_node);
        bVar1 = false;
        break;
      }
      std::_Rb_tree_const_iterator<CfgData::Node>::operator++(&aED,0);
    }
    if (bVar1) {
      std::_Rb_tree_const_iterator<CfgData::Node>::operator++(&bED,0);
    }
  } while( true );
}

Assistant:

void SpecificStrategy::matchBlocks(SpecificStrategy::Info::Block& aBlocks,
		SpecificStrategy::Info::Block& bBlocks) {
	for (std::set<CfgData::Node>::iterator bIT = bBlocks.perfect.begin(),
			bED = bBlocks.perfect.end(); bIT != bED; ) {
		bool next = true;
		for (std::set<CfgData::Node>::iterator aIT = aBlocks.perfect.begin(),
				aED = aBlocks.perfect.end(); aIT != aED; aIT++) {
			const CfgData::Node& aNode = *aIT;
			const CfgData::Node& bNode = *bIT;
			if (aNode == bNode) {
				bIT = bBlocks.perfect.erase(bIT);
				next = false;
				break;
			} else if (aNode.start < (bNode.start + bNode.size) &&
					   bNode.start < (aNode.start + aNode.size)) {
				aBlocks.conflict.insert(aNode);
				aBlocks.perfect.erase(aIT);

				bBlocks.conflict.insert(bNode);
				bIT = bBlocks.perfect.erase(bIT);

				next = false;
				break;
			}
		}

		if (next)
			bIT++;
	}
}